

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bool fmt::v7::detail::dragonbox::is_center_integer<double>
               (carrier_uint two_f,int exponent,int minus_k)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  
  if (exponent < 0x57) {
    if (exponent < 10) {
      if (-5 < exponent) {
        return true;
      }
      if (minus_k - exponent < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format-inl.h"
                    ,0x6e2,"");
      }
      if (two_f == 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format-inl.h"
                    ,0x6e3,"");
      }
      uVar2 = (minus_k - exponent) + 1;
      lVar1 = 0;
      if (two_f != 0) {
        for (; (two_f >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      bVar3 = uVar2 < (uint)lVar1;
      bVar4 = uVar2 == (uint)lVar1;
    }
    else {
      if (0x17 < minus_k) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format-inl.h"
                    ,0x6f2,"too large exponent");
      }
      bVar3 = two_f * *(long *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10)
              < *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10 + 8);
      bVar4 = two_f * *(long *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10)
              - *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10 + 8)
              == 0;
    }
    bVar3 = bVar3 || bVar4;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}